

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O3

void ERR_add_error_data(int num,...)

{
  char in_AL;
  ulong uVar1;
  undefined8 *puVar2;
  size_t sVar3;
  char *dst;
  undefined8 *puVar4;
  size_t sVar5;
  uint uVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 *local_120;
  uint local_108;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_120 = (undefined8 *)&stack0x00000008;
  uVar6 = 8;
  uVar7 = (ulong)(uint)num;
  local_e8[1] = in_RSI;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (num == 0) {
    uVar8 = 0;
  }
  else {
    local_108 = 8;
    uVar8 = 0;
    puVar4 = local_120;
    uVar9 = uVar7;
    do {
      if (local_108 < 0x29) {
        uVar1 = (ulong)local_108;
        local_108 = local_108 + 8;
        puVar2 = (undefined8 *)((long)local_e8 + uVar1);
      }
      else {
        puVar2 = puVar4;
        puVar4 = puVar4 + 1;
      }
      if ((char *)*puVar2 != (char *)0x0) {
        sVar3 = strlen((char *)*puVar2);
        bVar10 = CARRY8(uVar8,sVar3);
        uVar8 = uVar8 + sVar3;
        if (bVar10) {
          return;
        }
      }
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
    if (uVar8 == 0xffffffffffffffff) {
      return;
    }
  }
  dst = (char *)malloc(uVar8 + 1);
  if (dst != (char *)0x0) {
    *dst = '\0';
    if (num != 0) {
      do {
        uVar9 = (ulong)uVar6;
        if (uVar9 < 0x29) {
          uVar6 = uVar6 + 8;
          puVar4 = (undefined8 *)((long)local_e8 + uVar9);
        }
        else {
          puVar4 = local_120;
          local_120 = local_120 + 1;
        }
        if (((char *)*puVar4 != (char *)0x0) &&
           (sVar5 = OPENSSL_strlcat(dst,(char *)*puVar4,uVar8 + 1), uVar8 < sVar5)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err.cc"
                        ,0x288,"void err_add_error_vdata(unsigned int, __va_list_tag *)");
        }
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    err_set_error_data(dst);
  }
  return;
}

Assistant:

void ERR_add_error_data(unsigned count, ...) {
  va_list args;
  va_start(args, count);
  err_add_error_vdata(count, args);
  va_end(args);
}